

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O0

string * __thiscall
cfd::api::HDWalletApi::CreateExtPubkey(HDWalletApi *this,string *extkey,NetType net_type)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  NetType in_ECX;
  string *in_RDX;
  string *in_RDI;
  uint32_t check_version;
  ExtPrivkey privkey;
  ExtPrivkey *in_stack_fffffffffffffe70;
  allocator *paVar4;
  string *psVar5;
  CfdError error_code;
  undefined4 in_stack_fffffffffffffe90;
  ExtPubkey local_168;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [36];
  uint32_t local_cc;
  CfdSourceLocation local_c8;
  uint32_t local_9c;
  ExtPrivkey local_98;
  NetType local_1c;
  
  psVar5 = in_RDI;
  local_1c = in_ECX;
  core::ExtPrivkey::ExtPrivkey(&local_98,in_RDX);
  uVar1 = GetExtkeyVersion(kExtPrivkey,local_1c);
  local_9c = uVar1;
  uVar2 = core::ExtPrivkey::GetVersion(&local_98);
  if (uVar2 != local_9c) {
    local_c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_hdwallet.cpp"
                 ,0x2f);
    error_code = (CfdError)((ulong)psVar5 >> 0x20);
    local_c8.filename = local_c8.filename + 1;
    local_c8.line = 0x125;
    local_c8.funcname = "CreateExtPubkey";
    local_cc = core::ExtPrivkey::GetVersion(&local_98);
    core::logger::warn<unsigned_int>(&local_c8,"Version unmatch. key version: {}",&local_cc);
    local_f2 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    paVar4 = &local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"extkey networkType unmatch.",paVar4);
    core::CfdException::CfdException
              ((CfdException *)CONCAT44(uVar1,in_stack_fffffffffffffe90),error_code,in_RDI);
    local_f2 = 0;
    __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  core::ExtPrivkey::GetExtPubkey(&local_168,&local_98);
  core::ExtPubkey::ToString_abi_cxx11_(in_RDI,&local_168);
  core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffe70);
  core::ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffffe70);
  return psVar5;
}

Assistant:

std::string HDWalletApi::CreateExtPubkey(
    const std::string& extkey, NetType net_type) const {
  ExtPrivkey privkey(extkey);
  uint32_t check_version = GetExtkeyVersion(ExtKeyType::kExtPrivkey, net_type);
  if (privkey.GetVersion() != check_version) {
    warn(
        CFD_LOG_SOURCE, "Version unmatch. key version: {}",
        privkey.GetVersion());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "extkey networkType unmatch.");
  }
  return privkey.GetExtPubkey().ToString();
}